

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

Vec_Ptr_t * Acb_GenerateSignalNames2(Vec_Wec_t *vGates,Vec_Ptr_t *vIns,Vec_Ptr_t *vOuts)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  void **ppvVar5;
  char *pcVar6;
  int *piVar7;
  uint uVar8;
  Vec_Ptr_t *pVVar9;
  void **__s;
  Vec_Str_t *p;
  char *pcVar10;
  size_t sVar11;
  char *pcVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  
  uVar1 = vIns->nSize;
  uVar17 = (ulong)uVar1;
  uVar2 = vOuts->nSize;
  uVar3 = vGates->nSize;
  uVar15 = (ulong)uVar3;
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  uVar8 = 8;
  if (6 < uVar3 - 1) {
    uVar8 = uVar3;
  }
  pVVar9->nCap = uVar8;
  if (uVar8 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)(int)uVar8 << 3);
  }
  pVVar9->pArray = __s;
  pVVar9->nSize = uVar3;
  uVar16 = 0;
  memset(__s,0,(long)(int)uVar3 * 8);
  p = (Vec_Str_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  pcVar10 = (char *)malloc(1000);
  p->pArray = pcVar10;
  if (0 < (int)uVar1) {
    ppvVar5 = vIns->pArray;
    uVar18 = 0;
    if (0 < (int)uVar3) {
      uVar18 = uVar15;
    }
    do {
      pcVar6 = (char *)ppvVar5[uVar16];
      if (pcVar6 == (char *)0x0) {
        pcVar12 = (char *)0x0;
      }
      else {
        sVar11 = strlen(pcVar6);
        pcVar12 = (char *)malloc(sVar11 + 1);
        strcpy(pcVar12,pcVar6);
      }
      if (uVar18 == uVar16) goto LAB_0039ce1f;
      __s[uVar16] = pcVar12;
      uVar16 = uVar16 + 1;
    } while (uVar17 != uVar16);
  }
  iVar14 = (uVar3 - uVar2) - uVar1;
  if (0 < (int)uVar2) {
    ppvVar5 = vOuts->pArray;
    lVar19 = (long)(int)(iVar14 + uVar1) << 4;
    uVar16 = 0;
    do {
      lVar13 = (long)(int)(iVar14 + uVar1) + uVar16;
      if ((lVar13 < 0) || ((int)uVar3 <= lVar13)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      iVar4 = *(int *)((long)&vGates->pArray->nSize + lVar19);
      if (iVar4 < 1) {
LAB_0039ce3e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar7 = *(int **)((long)&vGates->pArray->pArray + lVar19);
      if (*piVar7 != 0xb) {
        __assert_fail("Vec_IntEntry(vGate, 0) == ABC_OPER_BIT_BUF",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                      ,0x837,
                      "Vec_Ptr_t *Acb_GenerateSignalNames2(Vec_Wec_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
      }
      if (iVar4 == 1) goto LAB_0039ce3e;
      pcVar6 = (char *)ppvVar5[uVar16];
      uVar8 = piVar7[1];
      if (pcVar6 == (char *)0x0) {
        pcVar12 = (char *)0x0;
      }
      else {
        sVar11 = strlen(pcVar6);
        pcVar12 = (char *)malloc(sVar11 + 1);
        strcpy(pcVar12,pcVar6);
      }
      if (((int)uVar8 < 0) || (uVar3 <= uVar8)) goto LAB_0039ce1f;
      __s[uVar8] = pcVar12;
      uVar16 = uVar16 + 1;
      lVar19 = lVar19 + 0x10;
    } while (uVar2 != uVar16);
  }
  if (0 < iVar14) {
    uVar16 = 1;
    do {
      if (((int)uVar1 < 0) || ((int)uVar15 <= (int)uVar17)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (__s[uVar17] == (void *)0x0) {
        Vec_StrPrintF(p,"ww%d",uVar16);
        uVar2 = p->nSize;
        if (uVar2 == p->nCap) {
          if ((int)uVar2 < 0x10) {
            pcVar10 = p->pArray;
            if (pcVar10 == (char *)0x0) {
              sVar11 = 0x10;
              goto LAB_0039cdb2;
            }
            sVar11 = 0x10;
LAB_0039cda1:
            pcVar10 = (char *)realloc(pcVar10,sVar11);
          }
          else {
            sVar11 = (ulong)uVar2 * 2;
            pcVar10 = p->pArray;
            if (pcVar10 != (char *)0x0) goto LAB_0039cda1;
LAB_0039cdb2:
            pcVar10 = (char *)malloc(sVar11);
          }
          p->pArray = pcVar10;
        }
        else {
          pcVar10 = p->pArray;
        }
        pcVar10[(int)uVar2] = '\0';
        pcVar10 = p->pArray;
        p->nCap = 0;
        p->nSize = 0;
        p->pArray = (char *)0x0;
        uVar15 = (ulong)(uint)pVVar9->nSize;
        if (pVVar9->nSize <= (int)uVar17) {
LAB_0039ce1f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        uVar16 = (ulong)((int)uVar16 + 1);
        __s = pVVar9->pArray;
        __s[uVar17] = pcVar10;
        pcVar10 = (char *)0x0;
      }
      uVar17 = uVar17 + 1;
    } while ((int)uVar17 < (int)(iVar14 + uVar1));
  }
  if (pcVar10 != (char *)0x0) {
    free(pcVar10);
  }
  free(p);
  return pVVar9;
}

Assistant:

Vec_Ptr_t * Acb_GenerateSignalNames2( Vec_Wec_t * vGates, Vec_Ptr_t * vIns, Vec_Ptr_t * vOuts )
{
    int nIns = Vec_PtrSize(vIns), nOuts = Vec_PtrSize(vOuts);
    int nNodes = Vec_WecSize(vGates) - nIns - nOuts;
    Vec_Ptr_t * vRes = Vec_PtrStart( Vec_WecSize(vGates) ); char * pName;
    Vec_Str_t * vStr = Vec_StrAlloc(1000); int i, nWires = 1;
    // create input names
    Vec_PtrForEachEntry( char *, vIns, pName, i )
        Vec_PtrWriteEntry( vRes, i, Abc_UtilStrsav(pName) );
    // create names for nodes driving outputs
    Vec_PtrForEachEntry( char *, vOuts, pName, i )
    {
        Vec_Int_t * vGate = Vec_WecEntry( vGates, nIns + nNodes + i );
        assert( Vec_IntEntry(vGate, 0) == ABC_OPER_BIT_BUF );
        Vec_PtrWriteEntry( vRes, Vec_IntEntry(vGate, 1), Abc_UtilStrsav(pName) );
    }
    for ( i = nIns; i < nIns + nNodes; i++ )
        if ( Vec_PtrEntry(vRes, i) == NULL )
        {
            Vec_StrPrintF( vStr, "ww%d", nWires++ );
            Vec_StrPush( vStr, '\0' );
            Vec_PtrWriteEntry( vRes, i, Vec_StrReleaseArray(vStr) );
        }
    Vec_StrFree( vStr );
    return vRes;
}